

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

int hydro_hash_hash(uint8_t *out,size_t out_len,void *in_,size_t in_len,char *ctx,uint8_t *key)

{
  int iVar1;
  char *in_RCX;
  hydro_hash_state *in_RDX;
  uint8_t *in_R8;
  uint8_t *in;
  hydro_hash_state st;
  size_t in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  hydro_hash_state *in_stack_ffffffffffffffb8;
  hydro_hash_state *in_stack_ffffffffffffffc0;
  
  iVar1 = hydro_hash_init(in_RDX,in_RCX,in_R8);
  if (((iVar1 == 0) &&
      (iVar1 = hydro_hash_update(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                 (size_t)in_stack_ffffffffffffffb0), iVar1 == 0)) &&
     (iVar1 = hydro_hash_final(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                               in_stack_ffffffffffffffa8), iVar1 == 0)) {
    return 0;
  }
  return -1;
}

Assistant:

int
hydro_hash_hash(uint8_t *out, size_t out_len, const void *in_, size_t in_len,
                const char ctx[hydro_hash_CONTEXTBYTES], const uint8_t key[hydro_hash_KEYBYTES])
{
    hydro_hash_state st;
    const uint8_t   *in = (const uint8_t *) in_;

    if (hydro_hash_init(&st, ctx, key) != 0 || hydro_hash_update(&st, in, in_len) != 0 ||
        hydro_hash_final(&st, out, out_len) != 0) {
        return -1;
    }
    return 0;
}